

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

int maybe_new_socket(uv_tcp_t *handle,int domain,unsigned_long flags)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint flags_00;
  socklen_t slen;
  sockaddr_storage saddr;
  
  flags_00 = (uint)flags;
  if (domain != 0) {
    iVar2 = (handle->io_watcher).fd;
    if (iVar2 == -1) {
      iVar2 = uv__socket(domain,1,0);
      if (iVar2 < 0) {
        return iVar2;
      }
      iVar1 = uv__stream_open((uv_stream_t *)handle,iVar2,flags_00);
      if (iVar1 != 0) {
        uv__close(iVar2);
        return iVar1;
      }
      if ((flags_00 >> 0xd & 1) == 0) {
        return 0;
      }
      slen = 0x80;
      saddr.ss_family = 0;
      saddr.__ss_padding[0] = '\0';
      saddr.__ss_padding[1] = '\0';
      saddr.__ss_padding[2] = '\0';
      saddr.__ss_padding[3] = '\0';
      saddr.__ss_padding[4] = '\0';
      saddr.__ss_padding[5] = '\0';
      saddr.__ss_padding[6] = '\0';
      saddr.__ss_padding[7] = '\0';
      saddr.__ss_padding[8] = '\0';
      saddr.__ss_padding[9] = '\0';
      saddr.__ss_padding[10] = '\0';
      saddr.__ss_padding[0xb] = '\0';
      saddr.__ss_padding[0xc] = '\0';
      saddr.__ss_padding[0xd] = '\0';
      saddr.__ss_padding[0xe] = '\0';
      saddr.__ss_padding[0xf] = '\0';
      saddr.__ss_padding[0x10] = '\0';
      saddr.__ss_padding[0x11] = '\0';
      saddr.__ss_padding[0x12] = '\0';
      saddr.__ss_padding[0x13] = '\0';
      saddr.__ss_padding[0x14] = '\0';
      saddr.__ss_padding[0x15] = '\0';
      saddr.__ss_padding[0x16] = '\0';
      saddr.__ss_padding[0x17] = '\0';
      saddr.__ss_padding[0x18] = '\0';
      saddr.__ss_padding[0x19] = '\0';
      saddr.__ss_padding[0x1a] = '\0';
      saddr.__ss_padding[0x1b] = '\0';
      saddr.__ss_padding[0x1c] = '\0';
      saddr.__ss_padding[0x1d] = '\0';
      saddr.__ss_padding[0x1e] = '\0';
      saddr.__ss_padding[0x1f] = '\0';
      saddr.__ss_padding[0x20] = '\0';
      saddr.__ss_padding[0x21] = '\0';
      saddr.__ss_padding[0x22] = '\0';
      saddr.__ss_padding[0x23] = '\0';
      saddr.__ss_padding[0x24] = '\0';
      saddr.__ss_padding[0x25] = '\0';
      saddr.__ss_padding[0x26] = '\0';
      saddr.__ss_padding[0x27] = '\0';
      saddr.__ss_padding[0x28] = '\0';
      saddr.__ss_padding[0x29] = '\0';
      saddr.__ss_padding[0x2a] = '\0';
      saddr.__ss_padding[0x2b] = '\0';
      saddr.__ss_padding[0x2c] = '\0';
      saddr.__ss_padding[0x2d] = '\0';
      saddr.__ss_padding[0x2e] = '\0';
      saddr.__ss_padding[0x2f] = '\0';
      saddr.__ss_padding[0x30] = '\0';
      saddr.__ss_padding[0x31] = '\0';
      saddr.__ss_padding[0x32] = '\0';
      saddr.__ss_padding[0x33] = '\0';
      saddr.__ss_padding[0x34] = '\0';
      saddr.__ss_padding[0x35] = '\0';
      saddr.__ss_padding[0x36] = '\0';
      saddr.__ss_padding[0x37] = '\0';
      saddr.__ss_padding[0x38] = '\0';
      saddr.__ss_padding[0x39] = '\0';
      saddr.__ss_padding[0x3a] = '\0';
      saddr.__ss_padding[0x3b] = '\0';
      saddr.__ss_padding[0x3c] = '\0';
      saddr.__ss_padding[0x3d] = '\0';
      saddr.__ss_padding[0x3e] = '\0';
      saddr.__ss_padding[0x3f] = '\0';
      saddr.__ss_padding[0x40] = '\0';
      saddr.__ss_padding[0x41] = '\0';
      saddr.__ss_padding[0x42] = '\0';
      saddr.__ss_padding[0x43] = '\0';
      saddr.__ss_padding[0x44] = '\0';
      saddr.__ss_padding[0x45] = '\0';
      saddr.__ss_padding[0x46] = '\0';
      saddr.__ss_padding[0x47] = '\0';
      saddr.__ss_padding[0x48] = '\0';
      saddr.__ss_padding[0x49] = '\0';
      saddr.__ss_padding[0x4a] = '\0';
      saddr.__ss_padding[0x4b] = '\0';
      saddr.__ss_padding[0x4c] = '\0';
      saddr.__ss_padding[0x4d] = '\0';
      saddr.__ss_padding[0x4e] = '\0';
      saddr.__ss_padding[0x4f] = '\0';
      saddr.__ss_padding[0x50] = '\0';
      saddr.__ss_padding[0x51] = '\0';
      saddr.__ss_padding[0x52] = '\0';
      saddr.__ss_padding[0x53] = '\0';
      saddr.__ss_padding[0x54] = '\0';
      saddr.__ss_padding[0x55] = '\0';
      saddr.__ss_padding[0x56] = '\0';
      saddr.__ss_padding[0x57] = '\0';
      saddr.__ss_padding[0x58] = '\0';
      saddr.__ss_padding[0x59] = '\0';
      saddr.__ss_padding[0x5a] = '\0';
      saddr.__ss_padding[0x5b] = '\0';
      saddr.__ss_padding[0x5c] = '\0';
      saddr.__ss_padding[0x5d] = '\0';
      saddr.__ss_padding[0x5e] = '\0';
      saddr.__ss_padding[0x5f] = '\0';
      saddr.__ss_padding[0x60] = '\0';
      saddr.__ss_padding[0x61] = '\0';
      saddr.__ss_padding[0x62] = '\0';
      saddr.__ss_padding[99] = '\0';
      saddr.__ss_padding[100] = '\0';
      saddr.__ss_padding[0x65] = '\0';
      saddr.__ss_padding[0x66] = '\0';
      saddr.__ss_padding[0x67] = '\0';
      saddr.__ss_padding[0x68] = '\0';
      saddr.__ss_padding[0x69] = '\0';
      saddr.__ss_padding[0x6a] = '\0';
      saddr.__ss_padding[0x6b] = '\0';
      saddr.__ss_padding[0x6c] = '\0';
      saddr.__ss_padding[0x6d] = '\0';
      saddr.__ss_padding[0x6e] = '\0';
      saddr.__ss_padding[0x6f] = '\0';
      saddr.__ss_padding[0x70] = '\0';
      saddr.__ss_padding[0x71] = '\0';
      saddr.__ss_padding[0x72] = '\0';
      saddr.__ss_padding[0x73] = '\0';
      saddr.__ss_padding[0x74] = '\0';
      saddr.__ss_padding[0x75] = '\0';
      saddr.__ss_align = 0;
      iVar1 = getsockname((handle->io_watcher).fd,(sockaddr *)&saddr,&slen);
      if ((iVar1 == 0) &&
         (iVar1 = bind((handle->io_watcher).fd,(sockaddr *)&saddr,slen), iVar1 == 0)) {
        return 0;
      }
      uv__close(iVar2);
LAB_001826aa:
      piVar3 = __errno_location();
      return -*piVar3;
    }
    if ((flags_00 >> 0xd & 1) != 0) {
      if ((handle->flags >> 0xd & 1) != 0) {
        handle->flags = handle->flags | flags_00;
        return 0;
      }
      slen = 0x80;
      saddr.ss_family = 0;
      saddr.__ss_padding[0] = '\0';
      saddr.__ss_padding[1] = '\0';
      saddr.__ss_padding[2] = '\0';
      saddr.__ss_padding[3] = '\0';
      saddr.__ss_padding[4] = '\0';
      saddr.__ss_padding[5] = '\0';
      saddr.__ss_padding[6] = '\0';
      saddr.__ss_padding[7] = '\0';
      saddr.__ss_padding[8] = '\0';
      saddr.__ss_padding[9] = '\0';
      saddr.__ss_padding[10] = '\0';
      saddr.__ss_padding[0xb] = '\0';
      saddr.__ss_padding[0xc] = '\0';
      saddr.__ss_padding[0xd] = '\0';
      saddr.__ss_padding[0xe] = '\0';
      saddr.__ss_padding[0xf] = '\0';
      saddr.__ss_padding[0x10] = '\0';
      saddr.__ss_padding[0x11] = '\0';
      saddr.__ss_padding[0x12] = '\0';
      saddr.__ss_padding[0x13] = '\0';
      saddr.__ss_padding[0x14] = '\0';
      saddr.__ss_padding[0x15] = '\0';
      saddr.__ss_padding[0x16] = '\0';
      saddr.__ss_padding[0x17] = '\0';
      saddr.__ss_padding[0x18] = '\0';
      saddr.__ss_padding[0x19] = '\0';
      saddr.__ss_padding[0x1a] = '\0';
      saddr.__ss_padding[0x1b] = '\0';
      saddr.__ss_padding[0x1c] = '\0';
      saddr.__ss_padding[0x1d] = '\0';
      saddr.__ss_padding[0x1e] = '\0';
      saddr.__ss_padding[0x1f] = '\0';
      saddr.__ss_padding[0x20] = '\0';
      saddr.__ss_padding[0x21] = '\0';
      saddr.__ss_padding[0x22] = '\0';
      saddr.__ss_padding[0x23] = '\0';
      saddr.__ss_padding[0x24] = '\0';
      saddr.__ss_padding[0x25] = '\0';
      saddr.__ss_padding[0x26] = '\0';
      saddr.__ss_padding[0x27] = '\0';
      saddr.__ss_padding[0x28] = '\0';
      saddr.__ss_padding[0x29] = '\0';
      saddr.__ss_padding[0x2a] = '\0';
      saddr.__ss_padding[0x2b] = '\0';
      saddr.__ss_padding[0x2c] = '\0';
      saddr.__ss_padding[0x2d] = '\0';
      saddr.__ss_padding[0x2e] = '\0';
      saddr.__ss_padding[0x2f] = '\0';
      saddr.__ss_padding[0x30] = '\0';
      saddr.__ss_padding[0x31] = '\0';
      saddr.__ss_padding[0x32] = '\0';
      saddr.__ss_padding[0x33] = '\0';
      saddr.__ss_padding[0x34] = '\0';
      saddr.__ss_padding[0x35] = '\0';
      saddr.__ss_padding[0x36] = '\0';
      saddr.__ss_padding[0x37] = '\0';
      saddr.__ss_padding[0x38] = '\0';
      saddr.__ss_padding[0x39] = '\0';
      saddr.__ss_padding[0x3a] = '\0';
      saddr.__ss_padding[0x3b] = '\0';
      saddr.__ss_padding[0x3c] = '\0';
      saddr.__ss_padding[0x3d] = '\0';
      saddr.__ss_padding[0x3e] = '\0';
      saddr.__ss_padding[0x3f] = '\0';
      saddr.__ss_padding[0x40] = '\0';
      saddr.__ss_padding[0x41] = '\0';
      saddr.__ss_padding[0x42] = '\0';
      saddr.__ss_padding[0x43] = '\0';
      saddr.__ss_padding[0x44] = '\0';
      saddr.__ss_padding[0x45] = '\0';
      saddr.__ss_padding[0x46] = '\0';
      saddr.__ss_padding[0x47] = '\0';
      saddr.__ss_padding[0x48] = '\0';
      saddr.__ss_padding[0x49] = '\0';
      saddr.__ss_padding[0x4a] = '\0';
      saddr.__ss_padding[0x4b] = '\0';
      saddr.__ss_padding[0x4c] = '\0';
      saddr.__ss_padding[0x4d] = '\0';
      saddr.__ss_padding[0x4e] = '\0';
      saddr.__ss_padding[0x4f] = '\0';
      saddr.__ss_padding[0x50] = '\0';
      saddr.__ss_padding[0x51] = '\0';
      saddr.__ss_padding[0x52] = '\0';
      saddr.__ss_padding[0x53] = '\0';
      saddr.__ss_padding[0x54] = '\0';
      saddr.__ss_padding[0x55] = '\0';
      saddr.__ss_padding[0x56] = '\0';
      saddr.__ss_padding[0x57] = '\0';
      saddr.__ss_padding[0x58] = '\0';
      saddr.__ss_padding[0x59] = '\0';
      saddr.__ss_padding[0x5a] = '\0';
      saddr.__ss_padding[0x5b] = '\0';
      saddr.__ss_padding[0x5c] = '\0';
      saddr.__ss_padding[0x5d] = '\0';
      saddr.__ss_padding[0x5e] = '\0';
      saddr.__ss_padding[0x5f] = '\0';
      saddr.__ss_padding[0x60] = '\0';
      saddr.__ss_padding[0x61] = '\0';
      saddr.__ss_padding[0x62] = '\0';
      saddr.__ss_padding[99] = '\0';
      saddr.__ss_padding[100] = '\0';
      saddr.__ss_padding[0x65] = '\0';
      saddr.__ss_padding[0x66] = '\0';
      saddr.__ss_padding[0x67] = '\0';
      saddr.__ss_padding[0x68] = '\0';
      saddr.__ss_padding[0x69] = '\0';
      saddr.__ss_padding[0x6a] = '\0';
      saddr.__ss_padding[0x6b] = '\0';
      saddr.__ss_padding[0x6c] = '\0';
      saddr.__ss_padding[0x6d] = '\0';
      saddr.__ss_padding[0x6e] = '\0';
      saddr.__ss_padding[0x6f] = '\0';
      saddr.__ss_padding[0x70] = '\0';
      saddr.__ss_padding[0x71] = '\0';
      saddr.__ss_padding[0x72] = '\0';
      saddr.__ss_padding[0x73] = '\0';
      saddr.__ss_padding[0x74] = '\0';
      saddr.__ss_padding[0x75] = '\0';
      saddr.__ss_align = 0;
      iVar2 = getsockname(iVar2,(sockaddr *)&saddr,&slen);
      if ((iVar2 != 0) ||
         ((((saddr.ss_family & 0xfff7) != 2 || (saddr.__ss_padding._0_2_ == 0)) &&
          (iVar2 = bind((handle->io_watcher).fd,(sockaddr *)&saddr,slen), iVar2 != 0))))
      goto LAB_001826aa;
    }
  }
  handle->flags = handle->flags | flags_00;
  return 0;
}

Assistant:

static int maybe_new_socket(uv_tcp_t* handle, int domain, unsigned long flags) {
  struct sockaddr_storage saddr;
  socklen_t slen;

  if (domain == AF_UNSPEC) {
    handle->flags |= flags;
    return 0;
  }

  if (uv__stream_fd(handle) != -1) {

    if (flags & UV_HANDLE_BOUND) {

      if (handle->flags & UV_HANDLE_BOUND) {
        /* It is already bound to a port. */
        handle->flags |= flags;
        return 0;
      }

      /* Query to see if tcp socket is bound. */
      slen = sizeof(saddr);
      memset(&saddr, 0, sizeof(saddr));
      if (getsockname(uv__stream_fd(handle), (struct sockaddr*) &saddr, &slen))
        return UV__ERR(errno);

      if ((saddr.ss_family == AF_INET6 &&
          ((struct sockaddr_in6*) &saddr)->sin6_port != 0) ||
          (saddr.ss_family == AF_INET &&
          ((struct sockaddr_in*) &saddr)->sin_port != 0)) {
        /* Handle is already bound to a port. */
        handle->flags |= flags;
        return 0;
      }

      /* Bind to arbitrary port */
      if (bind(uv__stream_fd(handle), (struct sockaddr*) &saddr, slen))
        return UV__ERR(errno);
    }

    handle->flags |= flags;
    return 0;
  }

  return new_socket(handle, domain, flags);
}